

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O0

void joypad_append(JoypadBuffer *buffer,JoypadButtons *buttons,Ticks ticks)

{
  Bool BVar1;
  u8 uVar2;
  JoypadState *pJVar3;
  JoypadState *state;
  Ticks ticks_local;
  JoypadButtons *buttons_local;
  JoypadBuffer *buffer_local;
  
  pJVar3 = alloc_joypad_state(buffer);
  pJVar3->ticks = ticks;
  uVar2 = joypad_pack_buttons(buttons);
  pJVar3->buttons = uVar2;
  BVar1 = buttons->up;
  (buffer->last_buttons).down = buttons->down;
  (buffer->last_buttons).up = BVar1;
  BVar1 = buttons->right;
  (buffer->last_buttons).left = buttons->left;
  (buffer->last_buttons).right = BVar1;
  BVar1 = buttons->select;
  (buffer->last_buttons).start = buttons->start;
  (buffer->last_buttons).select = BVar1;
  BVar1 = buttons->A;
  (buffer->last_buttons).B = buttons->B;
  (buffer->last_buttons).A = BVar1;
  return;
}

Assistant:

void joypad_append(JoypadBuffer* buffer, JoypadButtons* buttons, Ticks ticks) {
  JoypadState* state = alloc_joypad_state(buffer);
  state->ticks = ticks;
  state->buttons = joypad_pack_buttons(buttons);
  buffer->last_buttons = *buttons;
}